

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_indirect_indexed_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_12e98c::CpuIndirectIndexedTest::~CpuIndirectIndexedTest
          (CpuIndirectIndexedTest *this)

{
  CpuIndirectIndexedTest *this_local;
  
  n_e_s::core::test::CpuTest::~CpuTest(&this->super_CpuTest);
  return;
}

Assistant:

void run_read_instruction_without_pagecrossing(uint8_t instruction) {
        registers.pc = expected.pc = start_pc;
        registers.y = expected.y = 0x10;
        stage_instruction(instruction);
        expected.pc += 1;

        EXPECT_CALL(mmu, read_byte(start_pc + 1u)).WillOnce(Return(0x42));
        EXPECT_CALL(mmu, read_byte(0x42)).WillOnce(Return(0x34));
        EXPECT_CALL(mmu, read_byte(0x43)).WillOnce(Return(0x12));

        const uint16_t effective_address = 0x1234 + registers.y;
        EXPECT_CALL(mmu, read_byte(effective_address))
                .WillOnce(Return(memory_content));
        step_execution(5);
        EXPECT_EQ(expected, registers);
    }